

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

bool __thiscall
kj::anon_unknown_9::DiskHandle::tryTransfer
          (DiskHandle *this,PathPtr toPath,WriteMode toMode,Directory *fromDirectory,
          PathPtr fromPath,TransferMode mode,Directory *self)

{
  PathPtr fromPath_00;
  PathPtr path;
  PathPtr toPath_00;
  PathPtr toPath_01;
  int fromDirFd;
  undefined8 uVar1;
  char cVar2;
  size_t sVar3;
  Iface *pIVar4;
  bool bVar5;
  bool bVar6;
  char *pcVar7;
  TransferMode *pTVar8;
  PathPtr PVar9;
  StringPtr toPath_02;
  StringPtr fromPath_01;
  int error;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Fault f;
  TransferMode local_a4;
  PathPtr local_a0;
  int local_8c;
  DebugComparison<kj::TransferMode_&,_kj::TransferMode> local_88;
  String local_58;
  Function<int_(kj::StringPtr)> local_40;
  
  local_a0.parts.size_ = toPath.parts.size_;
  local_a0.parts.ptr = toPath.parts.ptr;
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_88.op.content.ptr = " > ";
  local_88.op.content.size_ = 4;
  local_88.result = (TransferMode *)local_a0.parts.size_ != (TransferMode *)0x0;
  local_a4 = mode;
  local_88.left = (TransferMode *)local_a0.parts.size_;
  if ((TransferMode *)local_a0.parts.size_ == (TransferMode *)0x0) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[19]>
              ((Fault *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x58e,FAILED,"toPath.size() > 0","_kjCondition,\"can\'t replace self\"",
               (DebugComparison<unsigned_long,_int> *)&local_88,(char (*) [19])"can\'t replace self"
              );
    kj::_::Debug::Fault::~Fault((Fault *)&local_58);
    return false;
  }
  if (mode != MOVE) {
    if (mode == LINK) {
      (**(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode)
                (&local_58,fromDirectory);
      cVar2 = (char)local_58.content.ptr;
      local_88.left = (TransferMode *)CONCAT71(local_88.left._1_7_,(char)local_58.content.ptr);
      if ((char)local_58.content.ptr == '\x01') {
        local_88.left = (TransferMode *)CONCAT44(local_58.content.ptr._4_4_,local_88.left._0_4_);
      }
      if ((char)local_58.content.ptr == '\0') {
        bVar5 = false;
      }
      else {
        path.parts.size_ = local_a0.parts.size_;
        path.parts.ptr = local_a0.parts.ptr;
        local_40.impl.ptr = (Iface *)operator_new(0x20);
        (local_40.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0064c9d0;
        local_40.impl.ptr[1]._vptr_Iface = (_func_int **)((long)&local_88.left + 4);
        local_40.impl.ptr[2]._vptr_Iface = (_func_int **)&fromPath;
        local_40.impl.ptr[3]._vptr_Iface = (_func_int **)this;
        local_40.impl.disposer =
             (Disposer *)
             &kj::_::
              HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::tryTransfer(kj::PathPtr,kj::WriteMode,kj::Directory_const&,kj::PathPtr,kj::TransferMode,kj::Directory_const&)const::{lambda(kj::StringPtr)#1}>>
              ::instance;
        bVar5 = tryReplaceNode(this,path,toMode,&local_40);
        pIVar4 = local_40.impl.ptr;
        if (local_40.impl.ptr != (Iface *)0x0) {
          local_40.impl.ptr = (Iface *)0x0;
          (**(local_40.impl.disposer)->_vptr_Disposer)
                    (local_40.impl.disposer,pIVar4->_vptr_Iface[-2] + (long)&pIVar4->_vptr_Iface);
        }
      }
      if (cVar2 != '\0') {
        return bVar5;
      }
    }
    goto LAB_004904bb;
  }
  (**(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode)(&local_88,fromDirectory);
  if ((char)local_88.left == '\x01') {
    fromDirFd = local_88.left._4_4_;
    local_88.left = &local_a4;
    local_88.result = local_a4 == MOVE;
    local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
    local_88.op.content.ptr = " == ";
    local_88.op.content.size_ = 5;
    if (!local_88.result) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::TransferMode&,kj::TransferMode>&>
                ((Fault *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x599,FAILED,"mode == TransferMode::MOVE","_kjCondition,",&local_88);
      kj::_::Debug::Fault::fatal((Fault *)&local_58);
    }
    local_8c = 0;
    PathPtr::toString((String *)&local_88,&local_a0,false);
    uVar1 = local_88._8_8_;
    pTVar8 = local_88.left;
    PathPtr::toString(&local_58,&fromPath,false);
    toPath_02.content.size_ = uVar1 + (ulong)(uVar1 == 0);
    if (uVar1 == 0) {
      pTVar8 = (TransferMode *)0x4d2b65;
    }
    pcVar7 = "";
    if (local_58.content.size_ != 0) {
      pcVar7 = local_58.content.ptr;
    }
    fromPath_01.content.size_ = local_58.content.size_ + (local_58.content.size_ == 0);
    toPath_02.content.ptr = (char *)pTVar8;
    fromPath_01.content.ptr = pcVar7;
    bVar5 = tryCommitReplacement(this,toPath_02,fromDirFd,fromPath_01,toMode,&local_8c);
    sVar3 = local_58.content.size_;
    pcVar7 = local_58.content.ptr;
    if (local_58.content.ptr != (char *)0x0) {
      local_58.content.ptr = (char *)0x0;
      local_58.content.size_ = 0;
      (**(local_58.content.disposer)->_vptr_ArrayDisposer)
                (local_58.content.disposer,pcVar7,1,sVar3,sVar3,0);
    }
    uVar1 = local_88._8_8_;
    pTVar8 = local_88.left;
    if (local_88.left != (TransferMode *)0x0) {
      local_88.left = (TransferMode *)0x0;
      local_88._8_8_ = 0;
      (*(code *)**(undefined8 **)local_88.op.content.ptr)
                (local_88.op.content.ptr,pTVar8,1,uVar1,uVar1,0);
    }
    if (bVar5) {
      bVar6 = true;
LAB_0049049c:
      bVar5 = false;
    }
    else {
      if (local_8c == 0) {
LAB_004905d8:
        bVar6 = false;
      }
      else {
        if (local_8c != 0x12) {
          if (local_8c == 2) {
            bVar5 = false;
            bVar6 = false;
            if ((~toMode & 5) != 0) goto LAB_004905da;
            bVar6 = false;
            if ((TransferMode *)local_a0.parts.size_ == (TransferMode *)0x0) goto LAB_004905dd;
            PVar9 = PathPtr::parent(&local_a0);
            bVar5 = tryMkdir(this,PVar9,CREATE_PARENT|MODIFY|CREATE,true);
            if (bVar5) {
              toPath_01.parts.size_ = local_a0.parts.size_;
              toPath_01.parts.ptr = local_a0.parts.ptr;
              PVar9.parts.size_ = fromPath.parts.size_;
              PVar9.parts.ptr = fromPath.parts.ptr;
              bVar6 = tryTransfer(this,toPath_01,toMode & ~CREATE_PARENT,fromDirectory,PVar9,
                                  local_a4,self);
              goto LAB_0049049c;
            }
          }
          else {
            kj::_::Debug::Fault::Fault<int,kj::PathPtr&,kj::PathPtr&>
                      ((Fault *)&local_88,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                       ,0x5b5,local_8c,"rename(fromPath, toPath)","fromPath, toPath",&fromPath,
                       &local_a0);
            kj::_::Debug::Fault::~Fault((Fault *)&local_88);
          }
          goto LAB_004905d8;
        }
        bVar6 = true;
      }
LAB_004905da:
      bVar5 = bVar6;
      bVar6 = false;
    }
  }
  else {
    bVar5 = true;
    bVar6 = false;
  }
LAB_004905dd:
  if (!bVar5) {
    return bVar6;
  }
LAB_004904bb:
  toPath_00.parts.size_ = local_a0.parts.size_;
  toPath_00.parts.ptr = local_a0.parts.ptr;
  fromPath_00.parts.size_ = fromPath.parts.size_;
  fromPath_00.parts.ptr = fromPath.parts.ptr;
  bVar5 = Directory::tryTransfer(self,toPath_00,toMode,fromDirectory,fromPath_00,local_a4);
  return bVar5;
}

Assistant:

bool tryTransfer(PathPtr toPath, WriteMode toMode,
                   const Directory& fromDirectory, PathPtr fromPath,
                   TransferMode mode, const Directory& self) const {
    KJ_REQUIRE(toPath.size() > 0, "can't replace self") { return false; }

    if (mode == TransferMode::LINK) {
      KJ_IF_SOME(fromFd, fromDirectory.getFd()) {
        // Other is a disk directory, so we can hopefully do an efficient move/link.
        return tryReplaceNode(toPath, toMode, [&](StringPtr candidatePath) {
          return linkat(fromFd, fromPath.toString().cStr(), fd, candidatePath.cStr(), 0);
        });
      };
    } else if (mode == TransferMode::MOVE) {
      KJ_IF_SOME(fromFd, fromDirectory.getFd()) {
        KJ_ASSERT(mode == TransferMode::MOVE);

        int error = 0;
        if (tryCommitReplacement(toPath.toString(), fromFd, fromPath.toString(), toMode,
                                 &error)) {
          return true;
        } else switch (error) {
          case 0:
            // Plain old WriteMode precondition failure.
            return false;
          case EXDEV:
            // Can't move between devices. Fall back to default implementation, which does
            // copy/delete.
            break;
          case ENOENT:
            // Either the destination directory doesn't exist or the source path doesn't exist.
            // Unfortunately we don't really know. If CREATE_PARENT was provided, try creating
            // the parent directory. Otherwise, we don't actually need to distinguish between
            // these two errors; just return false.
            if (has(toMode, WriteMode::CREATE) && has(toMode, WriteMode::CREATE_PARENT) &&
                toPath.size() > 0 && tryMkdir(toPath.parent(),
                    WriteMode::CREATE | WriteMode::MODIFY | WriteMode::CREATE_PARENT, true)) {
              // Retry, but make sure we don't try to create the parent again.
              return tryTransfer(toPath, toMode - WriteMode::CREATE_PARENT,
                                 fromDirectory, fromPath, mode, self);
            }
            return false;
          default:
            KJ_FAIL_SYSCALL("rename(fromPath, toPath)", error, fromPath, toPath) {
              return false;
            }
        }
      }
    }

    // OK, we can't do anything efficient using the OS. Fall back to default implementation.
    return self.Directory::tryTransfer(toPath, toMode, fromDirectory, fromPath, mode);
  }